

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticPropsCmd.cpp
# Opt level: O0

int custom_getopt_internal(int argc,char **argv,char *optstring,option *longopts,int *longind)

{
  int iVar1;
  int *in_RCX;
  option *in_RDX;
  char *in_RSI;
  undefined4 in_EDI;
  custom_getopt_data *in_R8;
  int unaff_retaddr;
  int result;
  undefined4 in_stack_fffffffffffffff8;
  
  custom_getopt_internal::d.custom_optind = custom_optind;
  custom_getopt_internal::d.custom_opterr = custom_opterr;
  iVar1 = getopt_internal_r(unaff_retaddr,(char **)CONCAT44(in_EDI,in_stack_fffffffffffffff8),in_RSI
                            ,in_RDX,in_RCX,in_R8);
  custom_optind = custom_getopt_internal::d.custom_optind;
  custom_optarg = custom_getopt_internal::d.custom_optarg;
  custom_optopt = custom_getopt_internal::d.custom_optopt;
  return iVar1;
}

Assistant:

static int custom_getopt_internal(int argc, char *const *argv, const char *optstring,
	const struct option *longopts, int *longind)
{
	int result;
	/* Keep a global copy of all internal members of d */
	static struct custom_getopt_data d;

	d.custom_optind = custom_optind;
	d.custom_opterr = custom_opterr;
	result = getopt_internal_r(argc, argv, optstring, longopts,
		longind, &d);
	custom_optind = d.custom_optind;
	custom_optarg = d.custom_optarg;
	custom_optopt = d.custom_optopt;
	return result;
}